

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O0

void __thiscall
chrono::ChLoad<chrono::ChLoaderGravity>::ChLoad
          (ChLoad<chrono::ChLoaderGravity> *this,shared_ptr<chrono::ChLoadableUVW> *mloadable)

{
  shared_ptr<chrono::ChLoadableUVW> local_28;
  shared_ptr<chrono::ChLoadableUVW> *local_18;
  shared_ptr<chrono::ChLoadableUVW> *mloadable_local;
  ChLoad<chrono::ChLoaderGravity> *this_local;
  
  local_18 = mloadable;
  mloadable_local = (shared_ptr<chrono::ChLoadableUVW> *)this;
  chrono::ChLoadBase::ChLoadBase(&this->super_ChLoadBase);
  *(undefined ***)this = &PTR__ChLoad_001c3ee8;
  std::shared_ptr<chrono::ChLoadableUVW>::shared_ptr(&local_28,mloadable);
  ChLoaderGravity::ChLoaderGravity(&this->loader,&local_28);
  std::shared_ptr<chrono::ChLoadableUVW>::~shared_ptr(&local_28);
  return;
}

Assistant:

ChLoad(std::shared_ptr<typename Tloader::type_loadable> mloadable) : loader(mloadable) {}